

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::ImageFeatureType_ImageSize::SharedCtor(ImageFeatureType_ImageSize *this)

{
  this->width_ = 0;
  this->height_ = 0;
  this->_cached_size_ = 0;
  return;
}

Assistant:

void ImageFeatureType_ImageSize::SharedCtor() {
  ::memset(&width_, 0, reinterpret_cast<char*>(&height_) -
    reinterpret_cast<char*>(&width_) + sizeof(height_));
  _cached_size_ = 0;
}